

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  bool bVar1;
  ostream *this_00;
  reference pvVar2;
  string local_6f0 [32];
  reference local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *l;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream ostr;
  int local_534;
  undefined1 local_530 [4];
  int defects;
  RegularExpression handleLeak;
  RegularExpression leak;
  RegularExpression invalidHeapArgument;
  RegularExpression uninitializedRead;
  RegularExpression unaddressableAccess;
  RegularExpression drMemoryError;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<int,_std::allocator<int>_> *results_local;
  string *log_local;
  string *str_local;
  cmCTestMemCheckHandler *this_local;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)results;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  cmsys::SystemTools::Split
            (str,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&unaddressableAccess.progsize,"^Error #[0-9]+");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&uninitializedRead.progsize,"UNADDRESSABLE ACCESS");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&invalidHeapArgument.progsize,"UNINITIALIZED READ");
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&leak.progsize,"INVALID HEAP ARGUMENT");
  cmsys::RegularExpression::RegularExpression((RegularExpression *)&handleLeak.progsize,"LEAK");
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_530,"HANDLE LEAK");
  local_534 = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
  l = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&l), bVar1) {
    local_6d0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    this_00 = std::operator<<((ostream *)&__range1,(string *)local_6d0);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    bVar1 = cmsys::RegularExpression::find
                      ((RegularExpression *)&unaddressableAccess.progsize,local_6d0);
    if (bVar1) {
      local_534 = local_534 + 1;
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)&uninitializedRead.progsize,local_6d0);
      if ((bVar1) ||
         (bVar1 = cmsys::RegularExpression::find
                            ((RegularExpression *)&invalidHeapArgument.progsize,local_6d0), bVar1))
      {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            lines.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0x15);
        *pvVar2 = *pvVar2 + 1;
      }
      else {
        bVar1 = cmsys::RegularExpression::find((RegularExpression *)&handleLeak.progsize,local_6d0);
        if ((bVar1) ||
           (bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_530,local_6d0), bVar1)
           ) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,0xe);
          *pvVar2 = *pvVar2 + 1;
        }
        else {
          bVar1 = cmsys::RegularExpression::find((RegularExpression *)&leak.progsize,local_6d0);
          if (bVar1) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                lines.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,7);
            *pvVar2 = *pvVar2 + 1;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)log,local_6f0);
  std::__cxx11::string::~string(local_6f0);
  this->DefectCount = local_534 + this->DefectCount;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_530);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&handleLeak.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&leak.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&invalidHeapArgument.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&uninitializedRead.progsize);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&unaddressableAccess.progsize);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return local_534 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckDrMemoryOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);

  cmsys::RegularExpression drMemoryError("^Error #[0-9]+");

  cmsys::RegularExpression unaddressableAccess("UNADDRESSABLE ACCESS");
  cmsys::RegularExpression uninitializedRead("UNINITIALIZED READ");
  cmsys::RegularExpression invalidHeapArgument("INVALID HEAP ARGUMENT");
  cmsys::RegularExpression leak("LEAK");
  cmsys::RegularExpression handleLeak("HANDLE LEAK");

  int defects = 0;

  std::ostringstream ostr;
  for (const auto& l : lines) {
    ostr << l << std::endl;
    if (drMemoryError.find(l)) {
      defects++;
      if (unaddressableAccess.find(l) || uninitializedRead.find(l)) {
        results[cmCTestMemCheckHandler::UMR]++;
      } else if (leak.find(l) || handleLeak.find(l)) {
        results[cmCTestMemCheckHandler::MLK]++;
      } else if (invalidHeapArgument.find(l)) {
        results[cmCTestMemCheckHandler::FMM]++;
      }
    }
  }

  log = ostr.str();

  this->DefectCount += defects;
  return defects == 0;
}